

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

void xmlDOMWrapFreeCtxt(xmlDOMWrapCtxtPtr_conflict ctxt)

{
  if (ctxt != (xmlDOMWrapCtxtPtr_conflict)0x0) {
    if ((xmlNsMapPtr)ctxt->namespaceMap != (xmlNsMapPtr)0x0) {
      xmlDOMWrapNsMapFree((xmlNsMapPtr)ctxt->namespaceMap);
    }
    (*xmlFree)(ctxt);
    return;
  }
  return;
}

Assistant:

void
xmlDOMWrapFreeCtxt(xmlDOMWrapCtxtPtr ctxt)
{
    if (ctxt == NULL)
	return;
    if (ctxt->namespaceMap != NULL)
	xmlDOMWrapNsMapFree((xmlNsMapPtr) ctxt->namespaceMap);
    /*
    * TODO: Store the namespace map in the context.
    */
    xmlFree(ctxt);
}